

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>> *this,
          VectorBlock<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1> *essential
          ,Scalar *tau,Scalar *workspace)

{
  long lVar1;
  VectorBlock<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1> *pVVar2;
  RhsNested *pRVar3;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
  *pCVar4;
  undefined8 *puVar5;
  byte bVar6;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_> *local_210;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_> tmp;
  Product<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
  local_1e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
  local_120;
  Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false> bottom;
  
  bVar6 = 0;
  if (*(long *)(this + 8) == 1) {
    local_1e8.m_lhs.m_matrix.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
    .m_data = (PointerType)(1.0 - *tau);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>_> *)this
               ,(Scalar *)&local_1e8);
  }
  else if ((*tau != 0.0) || (NAN(*tau))) {
    MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>::MapBase
              ((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)&tmp,workspace,*(Index *)(this + 0x10));
    Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_-1,_-1,_false>::Block
              (&bottom,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)this,1,0,
               *(long *)(this + 8) + -1,*(Index *)(this + 0x10));
    pVVar2 = essential;
    pCVar4 = &local_120;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      (((non_const_type *)&pCVar4->field_0x0)->
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
      .m_data = (pVVar2->
                super_Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>
                ).
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
                .m_data;
      pVVar2 = (VectorBlock<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1> *)
               ((long)pVVar2 + ((ulong)bVar6 * -2 + 1) * 8);
      pCVar4 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
                *)((long)pCVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    Product<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
    ::Product(&local_1e8,(Lhs *)&local_120,&bottom);
    local_210 = &tmp;
    NoAlias<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,3>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,3>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
               *)&local_210,
              (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>_>
               *)&local_1e8);
    Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_1,_-1,_false>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1,__1,_false>
                *)&local_1e8,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,3>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,3>,0,Eigen::Stride<0,0>>> *)&tmp
               ,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1,__1,_false>_>
                 *)&local_1e8);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>_>
                      *)&local_120,tau,(StorageBaseType *)&tmp);
    Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_1,_-1,_false>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1,__1,_false>
                *)&local_1e8,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>,1,-1,false>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,1,_1,false>>
                *)&local_1e8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_120);
    Eigen::operator*(&local_120,tau,(StorageBaseType *)essential);
    local_1e8.m_lhs.m_matrix.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
    .m_rows.m_value = local_120.m_lhs.m_rows.m_value;
    local_1e8.m_lhs.m_matrix.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
         (PointerType)local_120.m_lhs.m_functor.m_other;
    pRVar3 = &local_120.m_rhs;
    puVar5 = (undefined8 *)
             ((long)&local_1e8.m_lhs.m_matrix.
                     super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
                     .m_xpr + 8);
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar5 = (pRVar3->
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
                .m_data;
      pRVar3 = (RhsNested *)((long)pRVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    local_1e8.m_rhs.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.m_startRow.
    m_value = tmp.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value;
    local_1e8.m_rhs.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)tmp.
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
    local_1e8.m_rhs.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)
         tmp.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
         ._8_8_;
    local_210 = (Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_> *)&bottom;
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>,-1,-1,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,_1,_1,false>,Eigen::MatrixBase>
                  *)&local_210,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)&local_1e8);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}